

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::setVisible(QMdiSubWindowPrivate *this,WindowStateAction action,bool visible)

{
  QPointer<QMdi::ControlContainer> *this_00;
  QWidget *this_01;
  Data *pDVar1;
  bool bVar2;
  ControlContainer *this_02;
  QObject *pQVar3;
  ControllerWidget *this_03;
  
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(this->actions + action));
  if (bVar2) {
    QAction::setVisible(SUB81(this->actions[action].wp.value,0));
  }
  this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = &this->controlContainer;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar2) {
    this_02 = (ControlContainer *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(this_02,(QMdiSubWindow *)this_01);
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)this_02);
  }
  pDVar1 = (this_00->wp).d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->controlContainer).wp.value;
  }
  if ((*(long *)(pQVar3 + 0x40) == 0) || (*(int *)(*(long *)(pQVar3 + 0x40) + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = *(QObject **)(pQVar3 + 0x48);
  }
  this_03 = QtPrivate::qobject_cast_helper<QMdi::ControllerWidget*,QObject>(pQVar3);
  if (this_03 != (ControllerWidget *)0x0) {
    QMdi::ControllerWidget::setControlVisible(this_03,action,visible);
  }
  QWidget::update(this_01);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setVisible(WindowStateAction action, bool visible)
{
#ifndef QT_NO_ACTION
    if (actions[action])
        actions[action]->setVisible(visible);
#endif

    Q_Q(QMdiSubWindow);
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    if (ControllerWidget *ctrlWidget = qobject_cast<ControllerWidget *>
                                       (controlContainer->controllerWidget())) {
        ctrlWidget->setControlVisible(action, visible);
    }
    q->update();
}